

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LowererMDArch.cpp
# Opt level: O0

Instr * __thiscall LowererMDArch::LowerExitInstr(LowererMDArch *this,ExitInstr *exitInstr)

{
  IRType type_00;
  code *pcVar1;
  bool bVar2;
  RegNum RVar3;
  BOOLEAN BVar4;
  BOOL BVar5;
  int32 iVar6;
  uint uVar7;
  Which WVar8;
  undefined4 *puVar9;
  RegOpnd *pRVar10;
  RegOpnd *pRVar11;
  IndirOpnd *src1Opnd;
  Instr *pIVar12;
  IntConstOpnd *pIVar13;
  Instr *pIVar14;
  JITTimeFunctionBody *pJVar15;
  AsmJsJITInfo *this_00;
  Instr *retInstr;
  RegOpnd *retReg;
  IntConstOpnd *intSrc;
  Instr *pushInstr;
  Instr *movInstr;
  RegOpnd *rbpOpnd;
  RegOpnd *rspOpnd;
  Instr *addInstr;
  IntConstOpnd *stackSizeOpnd;
  uint32 stackArgsSize;
  Instr *popInstr;
  Instr *restoreInstr;
  RegOpnd *regOpnd;
  IRType type;
  RegNum reg;
  uint xmmOffset;
  RegOpnd *stackPointer;
  Instr *exitPrevInstr;
  uint32 savedRegSize;
  ExitInstr *exitInstr_local;
  LowererMDArch *this_local;
  
  exitPrevInstr._4_4_ = 0;
  pIVar14 = (exitInstr->super_Instr).m_prev;
  if (pIVar14 == (Instr *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar9 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/amd64/LowererMDArch.cpp"
                       ,0x80a,"(exitPrevInstr)",
                       "Can a function have only 1 instr ? Or is the instr chain broken");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar9 = 0;
  }
  RVar3 = GetRegStackPointer();
  pRVar10 = IR::RegOpnd::New((StackSym *)0x0,RVar3,TyInt64,this->m_func);
  regOpnd._4_4_ = 0;
  for (regOpnd._3_1_ = RegRAX; regOpnd._3_1_ < RegNumCount; regOpnd._3_1_ = regOpnd._3_1_ + RegRAX)
  {
    bVar2 = LinearScan::IsCalleeSaved(regOpnd._3_1_);
    if ((bVar2) &&
       ((BVar5 = Func::HasTry(this->m_func), BVar5 != 0 ||
        (BVar4 = BVUnitT<unsigned_long>::Test(&this->m_func->m_regsUsed,(uint)regOpnd._3_1_),
        BVar4 != '\0')))) {
      type_00 = RegTypes[regOpnd._3_1_];
      pRVar11 = IR::RegOpnd::New((StackSym *)0x0,regOpnd._3_1_,type_00,this->m_func);
      if (type_00 == TyFloat64) {
        src1Opnd = IR::IndirOpnd::New(pRVar10,regOpnd._4_4_,TyFloat64,this->m_func,false);
        pIVar12 = IR::Instr::New(MOVAPS,&pRVar11->super_Opnd,&src1Opnd->super_Opnd,this->m_func);
        regOpnd._4_4_ = regOpnd._4_4_ + 0x10;
        IR::Instr::InsertBefore(&exitInstr->super_Instr,pIVar12);
      }
      else {
        if (type_00 != TyInt64) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar9 = 1;
          bVar2 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/amd64/LowererMDArch.cpp"
                             ,0x825,"(type == TyInt64)","type == TyInt64");
          if (!bVar2) {
            pcVar1 = (code *)invalidInstructionException();
            (*pcVar1)();
          }
          puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar9 = 0;
        }
        pIVar12 = IR::Instr::New(POP,&pRVar11->super_Opnd,this->m_func);
        IR::Instr::InsertBefore(&exitInstr->super_Instr,pIVar12);
        exitPrevInstr._4_4_ = exitPrevInstr._4_4_ + 8;
      }
    }
  }
  iVar6 = Func::GetSavedRegSize(this->m_func);
  if (exitPrevInstr._4_4_ != iVar6) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar9 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/amd64/LowererMDArch.cpp"
                       ,0x82f,"(savedRegSize == (uint)this->m_func->GetSavedRegSize())",
                       "savedRegSize == (uint)this->m_func->GetSavedRegSize()");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar9 = 0;
  }
  uVar7 = Func::GetArgsSize(this->m_func);
  if (uVar7 == 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar9 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/amd64/LowererMDArch.cpp"
                       ,0x834,"(stackArgsSize)","stackArgsSize");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar9 = 0;
  }
  if ((exitPrevInstr._4_4_ != 0) || (regOpnd._4_4_ != 0)) {
    pIVar13 = IR::IntConstOpnd::New((ulong)uVar7,TyInt64,this->m_func,false);
    pIVar12 = IR::Instr::New(ADD,&pRVar10->super_Opnd,&pRVar10->super_Opnd,&pIVar13->super_Opnd,
                             this->m_func);
    IR::Instr::InsertAfter(pIVar14,pIVar12);
  }
  pRVar10 = IR::RegOpnd::New((StackSym *)0x0,RegRSP,TyInt64,this->m_func);
  pRVar11 = IR::RegOpnd::New((StackSym *)0x0,RegRBP,TyInt64,this->m_func);
  pIVar14 = IR::Instr::New(MOV,&pRVar10->super_Opnd,&pRVar11->super_Opnd,this->m_func);
  IR::Instr::InsertBefore(&exitInstr->super_Instr,pIVar14);
  pIVar14 = IR::Instr::New(POP,&pRVar11->super_Opnd,this->m_func);
  IR::Instr::InsertBefore(&exitInstr->super_Instr,pIVar14);
  pIVar13 = IR::IntConstOpnd::New(0,TyInt32,this->m_func,false);
  retInstr = (Instr *)0x0;
  pJVar15 = Func::GetJITFunctionBody(this->m_func);
  bVar2 = JITTimeFunctionBody::IsAsmJsMode(pJVar15);
  if ((!bVar2) || (bVar2 = Func::IsLoopBody(this->m_func), bVar2)) {
    RVar3 = GetRegReturn(TyInt64);
    retInstr = (Instr *)IR::RegOpnd::New((StackSym *)0x0,RVar3,TyInt64,this->m_func);
  }
  else {
    pJVar15 = Func::GetJITFunctionBody(this->m_func);
    this_00 = JITTimeFunctionBody::GetAsmJsInfo(pJVar15);
    WVar8 = AsmJsJITInfo::GetRetType(this_00);
    switch(WVar8) {
    case Int64:
    case Signed:
      RVar3 = GetRegReturn(TyInt64);
      retInstr = (Instr *)IR::RegOpnd::New((StackSym *)0x0,RVar3,TyInt64,this->m_func);
      break;
    case Double:
    case Float:
      RVar3 = GetRegReturnAsmJs(TyFloat64);
      retInstr = (Instr *)IR::RegOpnd::New((StackSym *)0x0,RVar3,TyFloat64,this->m_func);
      break;
    default:
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar9 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/amd64/LowererMDArch.cpp"
                         ,0x886,"((0))","(0)");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar9 = 0;
      break;
    case Void:
      break;
    case Int32x4:
      RVar3 = GetRegReturnAsmJs(TySimd128I4);
      retInstr = (Instr *)IR::RegOpnd::New((StackSym *)0x0,RVar3,TySimd128I4,this->m_func);
      break;
    case Uint32x4:
      RVar3 = GetRegReturnAsmJs(TySimd128U4);
      retInstr = (Instr *)IR::RegOpnd::New((StackSym *)0x0,RVar3,TySimd128U4,this->m_func);
      break;
    case Int16x8:
      RVar3 = GetRegReturnAsmJs(TySimd128I8);
      retInstr = (Instr *)IR::RegOpnd::New((StackSym *)0x0,RVar3,TySimd128I8,this->m_func);
      break;
    case Int8x16:
      RVar3 = GetRegReturnAsmJs(TySimd128I16);
      retInstr = (Instr *)IR::RegOpnd::New((StackSym *)0x0,RVar3,TySimd128U16,this->m_func);
      break;
    case Uint16x8:
      RVar3 = GetRegReturnAsmJs(TySimd128U8);
      retInstr = (Instr *)IR::RegOpnd::New((StackSym *)0x0,RVar3,TySimd128U8,this->m_func);
      break;
    case Uint8x16:
      RVar3 = GetRegReturnAsmJs(TySimd128U16);
      retInstr = (Instr *)IR::RegOpnd::New((StackSym *)0x0,RVar3,TySimd128U16,this->m_func);
      break;
    case Bool32x4:
      RVar3 = GetRegReturnAsmJs(TySimd128B4);
      retInstr = (Instr *)IR::RegOpnd::New((StackSym *)0x0,RVar3,TySimd128B4,this->m_func);
      break;
    case Bool16x8:
      RVar3 = GetRegReturnAsmJs(TySimd128B8);
      retInstr = (Instr *)IR::RegOpnd::New((StackSym *)0x0,RVar3,TySimd128B8,this->m_func);
      break;
    case Bool8x16:
      RVar3 = GetRegReturnAsmJs(TySimd128B16);
      retInstr = (Instr *)IR::RegOpnd::New((StackSym *)0x0,RVar3,TySimd128B16,this->m_func);
      break;
    case Float32x4:
      RVar3 = GetRegReturnAsmJs(TySimd128F4);
      retInstr = (Instr *)IR::RegOpnd::New((StackSym *)0x0,RVar3,TySimd128F4,this->m_func);
      break;
    case Float64x2:
      RVar3 = GetRegReturnAsmJs(TySimd128D2);
      retInstr = (Instr *)IR::RegOpnd::New((StackSym *)0x0,RVar3,TySimd128D2,this->m_func);
      break;
    case Int64x2:
      RVar3 = GetRegReturnAsmJs(TySimd128I2);
      retInstr = (Instr *)IR::RegOpnd::New((StackSym *)0x0,RVar3,TySimd128I2,this->m_func);
    }
  }
  pIVar14 = IR::Instr::New(RET,this->m_func);
  IR::Instr::SetSrc1(pIVar14,&pIVar13->super_Opnd);
  if (retInstr != (Instr *)0x0) {
    IR::Instr::SetSrc2(pIVar14,(Opnd *)retInstr);
  }
  IR::Instr::InsertBefore(&exitInstr->super_Instr,pIVar14);
  pIVar14->m_opcode = RET;
  return &exitInstr->super_Instr;
}

Assistant:

IR::Instr *
LowererMDArch::LowerExitInstr(IR::ExitInstr * exitInstr)
{
    uint32 savedRegSize = 0;

    // POP used callee-saved registers

    IR::Instr * exitPrevInstr = exitInstr->m_prev;
    AssertMsg(exitPrevInstr, "Can a function have only 1 instr ? Or is the instr chain broken");

    IR::RegOpnd *stackPointer = IR::RegOpnd::New(nullptr, GetRegStackPointer(), TyMachReg, this->m_func);

    unsigned xmmOffset = 0;

    for (RegNum reg = (RegNum)(RegNOREG + 1); reg < RegNumCount; reg = (RegNum)(reg+1))
    {
        if (LinearScan::IsCalleeSaved(reg) && (this->m_func->HasTry() || this->m_func->m_regsUsed.Test(reg)))
        {
            IRType       type    = RegTypes[reg];
            IR::RegOpnd *regOpnd = IR::RegOpnd::New(nullptr, reg, type, this->m_func);

            if (type == TyFloat64)
            {
                IR::Instr *restoreInstr = IR::Instr::New(Js::OpCode::MOVAPS,
                                                         regOpnd,
                                                         IR::IndirOpnd::New(stackPointer,
                                                                            xmmOffset,
                                                                            type,
                                                                            this->m_func),
                                                         this->m_func);
                xmmOffset += (MachDouble * 2);
                exitInstr->InsertBefore(restoreInstr);
            }
            else
            {
                Assert(type == TyInt64);

                IR::Instr *popInstr = IR::Instr::New(Js::OpCode::POP, regOpnd, this->m_func);
                exitInstr->InsertBefore(popInstr);

                savedRegSize += MachPtr;
            }
        }
    }

    Assert(savedRegSize == (uint)this->m_func->GetSavedRegSize());


    // Generate ADD RSP, argsStackSize before the register restore (if there are any)
    uint32 stackArgsSize = this->m_func->GetArgsSize();
    Assert(stackArgsSize);
    if (savedRegSize || xmmOffset)
    {
        IR::IntConstOpnd *stackSizeOpnd = IR::IntConstOpnd::New(stackArgsSize, TyMachReg, this->m_func);
        IR::Instr *addInstr = IR::Instr::New(Js::OpCode::ADD, stackPointer, stackPointer, stackSizeOpnd, this->m_func);
        exitPrevInstr->InsertAfter(addInstr);
    }

    //
    // useful register operands
    //
    IR::RegOpnd * rspOpnd = IR::RegOpnd::New(nullptr, RegRSP, TyMachReg, this->m_func);
    IR::RegOpnd * rbpOpnd = IR::RegOpnd::New(nullptr, RegRBP, TyMachReg, this->m_func);

    // Restore frame

    // Generate MOV RSP, RBP

    IR::Instr * movInstr = IR::Instr::New(Js::OpCode::MOV, rspOpnd, rbpOpnd, this->m_func);
    exitInstr->InsertBefore(movInstr);

    // Generate POP RBP

    IR::Instr * pushInstr = IR::Instr::New(Js::OpCode::POP, rbpOpnd, this->m_func);
    exitInstr->InsertBefore(pushInstr);

    // Insert RET
    IR::IntConstOpnd * intSrc = IR::IntConstOpnd::New(0, TyInt32, this->m_func);
    IR::RegOpnd *retReg = nullptr;
    if (m_func->GetJITFunctionBody()->IsAsmJsMode() && !m_func->IsLoopBody())
    {
        switch (m_func->GetJITFunctionBody()->GetAsmJsInfo()->GetRetType())
        {
        case Js::AsmJsRetType::Double:
        case Js::AsmJsRetType::Float:
            retReg = IR::RegOpnd::New(nullptr, this->GetRegReturnAsmJs(TyMachDouble), TyMachDouble, this->m_func);
            break;
#ifdef ENABLE_WASM_SIMD
        case Js::AsmJsRetType::Int32x4:
            retReg = IR::RegOpnd::New(nullptr, this->GetRegReturnAsmJs(TySimd128I4), TySimd128I4, this->m_func);
            break;
        case Js::AsmJsRetType::Int16x8:
            retReg = IR::RegOpnd::New(nullptr, this->GetRegReturnAsmJs(TySimd128I8), TySimd128I8, this->m_func);
            break;
        case Js::AsmJsRetType::Int8x16:
            retReg = IR::RegOpnd::New(nullptr, this->GetRegReturnAsmJs(TySimd128I16), TySimd128U16, this->m_func);
            break;
        case Js::AsmJsRetType::Uint32x4:
            retReg = IR::RegOpnd::New(nullptr, this->GetRegReturnAsmJs(TySimd128U4), TySimd128U4, this->m_func);
            break;
        case Js::AsmJsRetType::Uint16x8:
            retReg = IR::RegOpnd::New(nullptr, this->GetRegReturnAsmJs(TySimd128U8), TySimd128U8, this->m_func);
            break;
        case Js::AsmJsRetType::Uint8x16:
            retReg = IR::RegOpnd::New(nullptr, this->GetRegReturnAsmJs(TySimd128U16), TySimd128U16, this->m_func);
            break;
        case Js::AsmJsRetType::Bool32x4:
            retReg = IR::RegOpnd::New(nullptr, this->GetRegReturnAsmJs(TySimd128B4), TySimd128B4, this->m_func);
            break;
        case Js::AsmJsRetType::Bool16x8:
            retReg = IR::RegOpnd::New(nullptr, this->GetRegReturnAsmJs(TySimd128B8), TySimd128B8, this->m_func);
            break;
        case Js::AsmJsRetType::Bool8x16:
            retReg = IR::RegOpnd::New(nullptr, this->GetRegReturnAsmJs(TySimd128B16), TySimd128B16, this->m_func);
            break;
        case Js::AsmJsRetType::Float32x4:
            retReg = IR::RegOpnd::New(nullptr, this->GetRegReturnAsmJs(TySimd128F4), TySimd128F4, this->m_func);
            break;
        case Js::AsmJsRetType::Float64x2:
            retReg = IR::RegOpnd::New(nullptr, this->GetRegReturnAsmJs(TySimd128D2), TySimd128D2, this->m_func);
            break;
        case Js::AsmJsRetType::Int64x2:
            retReg = IR::RegOpnd::New(nullptr, this->GetRegReturnAsmJs(TySimd128I2), TySimd128I2, this->m_func);
            break;
#endif
        case Js::AsmJsRetType::Int64:
        case Js::AsmJsRetType::Signed:
            retReg = IR::RegOpnd::New(nullptr, this->GetRegReturn(TyMachReg), TyMachReg, this->m_func);
            break;
        case Js::AsmJsRetType::Void:
            break;
        default:
            Assume(UNREACHED);
        }
    }
    else
    {
        retReg = IR::RegOpnd::New(nullptr, this->GetRegReturn(TyMachReg), TyMachReg, this->m_func);
    }


    // Generate RET
    IR::Instr * retInstr = IR::Instr::New(Js::OpCode::RET, this->m_func);
    retInstr->SetSrc1(intSrc);
    if (retReg)
    {
        retInstr->SetSrc2(retReg);
    }
    exitInstr->InsertBefore(retInstr);

    retInstr->m_opcode = Js::OpCode::RET;


    return exitInstr;
}